

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall CMU462::Application::executeFileOp(Application *this,int codepoint)

{
  ostream *poVar1;
  stringstream filename;
  char *local_1b8 [4];
  stringstream local_198 [16];
  ostream local_188 [376];
  
  if ((this->readyLoad == false) && (this->readyWrite != true)) {
    return;
  }
  if (9 < codepoint - 0x30U) {
    this->readyWrite = false;
    this->readyLoad = false;
    return;
  }
  std::__cxx11::stringstream::stringstream(local_198);
  poVar1 = std::operator<<(local_188,"Scotty3D_buffer");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,codepoint - 0x30U);
  std::operator<<(poVar1,".dae");
  if (this->readyWrite == true) {
    std::__cxx11::stringbuf::str();
    writeScene(this,local_1b8[0]);
  }
  else {
    if (this->readyLoad != true) goto LAB_0019d4be;
    std::__cxx11::stringbuf::str();
    loadScene(this,local_1b8[0]);
  }
  std::__cxx11::string::~string((string *)local_1b8);
LAB_0019d4be:
  this->readyWrite = false;
  this->readyLoad = false;
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

void Application::executeFileOp(int codepoint) {
  // If the user already pressed 'w' or 'l' (indicating that
  // they wanted to write or load a file) AND the next key
  // they pressed was a number, then we should go ahead and
  // write/load the file corresponding to the specified number.

  if (!readyLoad && !readyWrite) return;

  // Convert Unicode codepoint to integer.  (Probably a more
  // clever way to do this, but often a foolproof solution is
  // (much) better than a clever one...)
  int index = -1;
  switch (codepoint) {
    case '0':
      index = 0;
      break;
    case '1':
      index = 1;
      break;
    case '2':
      index = 2;
      break;
    case '3':
      index = 3;
      break;
    case '4':
      index = 4;
      break;
    case '5':
      index = 5;
      break;
    case '6':
      index = 6;
      break;
    case '7':
      index = 7;
      break;
    case '8':
      index = 8;
      break;
    case '9':
      index = 9;
      break;
    default:
      readyLoad = readyWrite = false;
      return;
      break;
  }

  stringstream filename;
  filename << "Scotty3D_buffer" << index << ".dae";

  if (readyWrite)
    writeScene(filename.str().c_str());
  else if (readyLoad)
    loadScene(filename.str().c_str());

  readyLoad = readyWrite = false;
}